

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O2

void composition_xor(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  uint y;
  uint32_t uVar1;
  ulong uVar2;
  int i_1;
  int i;
  ulong uVar3;
  
  uVar2 = 0;
  if (0 < length) {
    uVar2 = (ulong)(uint)length;
  }
  if (const_alpha == 0xff) {
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = INTERPOLATE_PIXEL(src[uVar3],~dest[uVar3] >> 0x18,dest[uVar3],~src[uVar3] >> 0x18);
      dest[uVar3] = uVar1;
    }
  }
  else {
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      y = dest[uVar3];
      uVar1 = BYTE_MUL(src[uVar3],const_alpha);
      uVar1 = INTERPOLATE_PIXEL(uVar1,~y >> 0x18,y,~uVar1 >> 0x18);
      dest[uVar3] = uVar1;
    }
  }
  return;
}

Assistant:

static void composition_xor(uint32_t* dest, int length, const uint32_t* src, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        for(int i = 0; i < length; i++) {
            uint32_t d = dest[i];
            uint32_t s = src[i];
            dest[i] = INTERPOLATE_PIXEL(s, plutovg_alpha(~d), d, plutovg_alpha(~s));
        }
    } else {
        for(int i = 0; i < length; i++) {
            uint32_t d = dest[i];
            uint32_t s = BYTE_MUL(src[i], const_alpha);
            dest[i] = INTERPOLATE_PIXEL(s, plutovg_alpha(~d), d, plutovg_alpha(~s));
        }
    }
}